

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::EnumValueSymbol_const*>::
emplace_back<slang::ast::EnumValueSymbol_const*>
          (SmallVectorBase<const_slang::ast::EnumValueSymbol_*> *this,EnumValueSymbol **args)

{
  iterator ppEVar1;
  undefined8 *in_RSI;
  SmallVectorBase<const_slang::ast::EnumValueSymbol_*> *in_RDI;
  EnumValueSymbol **in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<const_slang::ast::EnumValueSymbol_*> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::end(in_RDI);
    local_8 = emplaceRealloc<slang::ast::EnumValueSymbol_const*>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppEVar1 = SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::end(in_RDI);
    *ppEVar1 = (EnumValueSymbol *)*in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<const_slang::ast::EnumValueSymbol_*>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }